

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * fts3ReallocOrFree(void *pOrig,sqlite3_int64 nNew)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    pvVar2 = sqlite3Realloc(pOrig,nNew);
  }
  else {
    pvVar2 = (void *)0x0;
  }
  if (pvVar2 == (void *)0x0) {
    sqlite3_free(pOrig);
  }
  return pvVar2;
}

Assistant:

static void *fts3ReallocOrFree(void *pOrig, sqlite3_int64 nNew){
  void *pRet = sqlite3_realloc64(pOrig, nNew);
  if( !pRet ){
    sqlite3_free(pOrig);
  }
  return pRet;
}